

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

void __thiscall kj::_::CidrRange::CidrRange(CidrRange *this,StringPtr pattern)

{
  ulong count;
  undefined8 __n;
  uint uVar1;
  int iVar2;
  StringPtr *this_00;
  Fault f;
  Array<char> addr_heap;
  StringPtr pattern_local;
  char addr_stack [128];
  
  pattern_local.content.size_ = pattern.content.size_;
  pattern_local.content.ptr = pattern.content.ptr;
  StringPtr::findFirst((StringPtr *)addr_stack,(char)&pattern_local);
  __n = addr_stack._8_8_;
  if (addr_stack[0] != '\x01') {
    Debug::Fault::Fault<kj::Exception::Type,char_const(&)[13],kj::StringPtr&>
              ((Fault *)addr_stack,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++"
               ,0x7cb,FAILED,"pattern.findFirst(\'/\') != nullptr","\"invalid CIDR\", pattern",
               (char (*) [13])"invalid CIDR",&pattern_local);
    Debug::Fault::fatal((Fault *)addr_stack);
  }
  this_00 = (StringPtr *)addr_stack;
  count = addr_stack._8_8_ + 1;
  addr_stack._0_8_ = pattern_local.content.ptr + count;
  addr_stack._8_8_ = pattern_local.content.size_ - count;
  uVar1 = StringPtr::parseAs<unsigned_int>(this_00);
  this->bitCount = uVar1;
  if (count < 0x81) {
    addr_heap.ptr = (char *)0x0;
    addr_heap.size_ = 0;
    addr_heap.disposer = (ArrayDisposer *)0x0;
  }
  else {
    this_00 = (StringPtr *)HeapArrayDisposer::allocate<char>(count);
    addr_heap.disposer = (ArrayDisposer *)&HeapArrayDisposer::instance;
    addr_heap.ptr = (char *)this_00;
    addr_heap.size_ = count;
  }
  memcpy(this_00,pattern_local.content.ptr,__n);
  *(undefined1 *)((long)&(this_00->content).ptr + __n) = 0;
  StringPtr::findFirst((StringPtr *)&f,(char)&pattern_local);
  if ((char)f.exception == '\0') {
    this->family = 2;
    if (0x20 < this->bitCount) {
      Debug::Fault::Fault<kj::Exception::Type,char_const(&)[13],kj::StringPtr&>
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++"
                 ,0x7d5,FAILED,"bitCount <= 32","\"invalid CIDR\", pattern",
                 (char (*) [13])"invalid CIDR",&pattern_local);
      Debug::Fault::fatal(&f);
    }
    iVar2 = 2;
  }
  else {
    this->family = 10;
    if (0x80 < this->bitCount) {
      Debug::Fault::Fault<kj::Exception::Type,char_const(&)[13],kj::StringPtr&>
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++"
                 ,0x7d8,FAILED,"bitCount <= 128","\"invalid CIDR\", pattern",
                 (char (*) [13])"invalid CIDR",&pattern_local);
      Debug::Fault::fatal(&f);
    }
    iVar2 = 10;
  }
  iVar2 = inet_pton(iVar2,(char *)this_00,this->bits);
  if (0 < iVar2) {
    zeroIrrelevantBits(this);
    Array<char>::~Array(&addr_heap);
    return;
  }
  Debug::Fault::Fault<kj::Exception::Type,char_const(&)[13],kj::StringPtr&>
            (&f,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++"
             ,0x7db,FAILED,"inet_pton(family, addr.begin(), bits) > 0","\"invalid CIDR\", pattern",
             (char (*) [13])"invalid CIDR",&pattern_local);
  Debug::Fault::fatal(&f);
}

Assistant:

CidrRange::CidrRange(StringPtr pattern) {
  size_t slashPos = KJ_REQUIRE_NONNULL(pattern.findFirst('/'), "invalid CIDR", pattern);

  bitCount = pattern.slice(slashPos + 1).parseAs<uint>();

  KJ_STACK_ARRAY(char, addr, slashPos + 1, 128, 128);
  memcpy(addr.begin(), pattern.begin(), slashPos);
  addr[slashPos] = '\0';

  if (pattern.findFirst(':') == nullptr) {
    family = AF_INET;
    KJ_REQUIRE(bitCount <= 32, "invalid CIDR", pattern);
  } else {
    family = AF_INET6;
    KJ_REQUIRE(bitCount <= 128, "invalid CIDR", pattern);
  }

  KJ_ASSERT(inet_pton(family, addr.begin(), bits) > 0, "invalid CIDR", pattern);
  zeroIrrelevantBits();
}